

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O2

int __thiscall
ON_UuidPairList2::GetId1s(ON_UuidPairList2 *this,ON_SimpleArray<ON_UUID_struct> *uuid_list)

{
  int iVar1;
  __node_base _Var2;
  
  ON_SimpleArray<ON_UUID_struct>::Reserve
            (uuid_list,
             (ulong)*(uint *)((long)&((this->m_private)._M_t.
                                      super___uniq_ptr_impl<ON_UuidPairList2_Private,_std::default_delete<ON_UuidPairList2_Private>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ON_UuidPairList2_Private_*,_std::default_delete<ON_UuidPairList2_Private>_>
                                      .super__Head_base<0UL,_ON_UuidPairList2_Private_*,_false>.
                                     _M_head_impl)->super_ON_UuidList2_Private<ON_UUID_struct> +
                             0x18));
  _Var2._M_nxt = (_Hash_node_base *)
                 ((long)&((this->m_private)._M_t.
                          super___uniq_ptr_impl<ON_UuidPairList2_Private,_std::default_delete<ON_UuidPairList2_Private>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ON_UuidPairList2_Private_*,_std::default_delete<ON_UuidPairList2_Private>_>
                          .super__Head_base<0UL,_ON_UuidPairList2_Private_*,_false>._M_head_impl)->
                         super_ON_UuidList2_Private<ON_UUID_struct> + 0x10);
  iVar1 = 0;
  while (_Var2._M_nxt = (_Var2._M_nxt)->_M_nxt, _Var2._M_nxt != (_Hash_node_base *)0x0) {
    ON_SimpleArray<ON_UUID_struct>::Append(uuid_list,(ON_UUID_struct *)(_Var2._M_nxt + 1));
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int ON_UuidPairList2::GetId1s(ON_SimpleArray<ON_UUID>& uuid_list) const
{
  uuid_list.Reserve(Count());

  int i = 0;
  for (const auto& pair : m_private->map)
  {
    uuid_list.Append(pair.first);
    i++;
  }
  return i;
}